

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_outlines_fuzzer.cc
# Opt level: O2

void __thiscall FuzzHelper::run(FuzzHelper *this)

{
  doChecks(this);
  return;
}

Assistant:

void
FuzzHelper::run()
{
    // The goal here is that you should be able to throw anything at
    // libqpdf and it will respond without any memory errors and never
    // do anything worse than throwing a QPDFExc or
    // std::runtime_error. Throwing any other kind of exception,
    // segfaulting, or having a memory error (when built with
    // appropriate sanitizers) will all cause abnormal exit.
    try {
        doChecks();
    } catch (QPDFExc const& e) {
        std::cerr << "QPDFExc: " << e.what() << std::endl;
    } catch (std::runtime_error const& e) {
        std::cerr << "runtime_error: " << e.what() << std::endl;
    }
}